

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_resolv_check(connectdata *conn,Curl_dns_entry **dns)

{
  int iVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  uint uVar6;
  CURLcode CVar7;
  timediff_t tVar8;
  long lVar9;
  uint uVar10;
  curltime cVar11;
  curltime newer;
  curltime older;
  
  if (((conn->bits).field_0x7 & 0x40) != 0) {
    CVar7 = Curl_doh_is_resolved(conn,dns);
    return CVar7;
  }
  pCVar2 = conn->data;
  pvVar3 = (conn->async).os_specific;
  *dns = (Curl_dns_entry *)0x0;
  if (pvVar3 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  iVar1 = *(int *)((long)pvVar3 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  if (iVar1 != 0) {
    getaddrinfo_complete(conn);
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *dns = (conn->async).dns;
      return CURLE_OK;
    }
    CVar7 = resolver_error(conn);
    destroy_async_data(&conn->async);
    return CVar7;
  }
  cVar11 = Curl_now();
  uVar4 = (pCVar2->progress).t_startsingle.tv_sec;
  uVar5 = (pCVar2->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar11._0_12_,0);
  newer.tv_usec = SUB124(cVar11._0_12_,8);
  older._12_4_ = 0;
  tVar8 = Curl_timediff(newer,older);
  lVar9 = 0;
  if (0 < tVar8) {
    lVar9 = tVar8;
  }
  if (*(int *)((long)pvVar3 + 8) == 0) {
    uVar6 = 1;
  }
  else {
    uVar10 = *(int *)((long)pvVar3 + 8) << (*(long *)((long)pvVar3 + 0x10) <= lVar9);
    uVar6 = 0xfa;
    if (uVar10 < 0xfa) {
      uVar6 = uVar10;
    }
    if ((lVar9 < *(long *)((long)pvVar3 + 0x10)) && (uVar10 < 0xfb)) goto LAB_0010c88f;
  }
  *(uint *)((long)pvVar3 + 8) = uVar6;
LAB_0010c88f:
  *(ulong *)((long)pvVar3 + 0x10) = lVar9 + (ulong)uVar6;
  Curl_expire(conn->data,(ulong)uVar6,EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolv_check(struct connectdata *conn,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)dns;
#endif

  if(conn->bits.doh)
    return Curl_doh_is_resolved(conn, dns);
  return Curl_resolver_is_resolved(conn, dns);
}